

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small_vector.hpp
# Opt level: O3

void __thiscall
tf::SmallVectorImpl<tf::Node*>::append<std::move_iterator<tf::Node**>>
          (SmallVectorImpl<tf::Node*> *this,move_iterator<tf::Node_**> in_start,
          move_iterator<tf::Node_**> in_end)

{
  void *__dest;
  ulong __n;
  
  __n = (long)in_end._M_current - (long)in_start._M_current;
  __dest = *(void **)(this + 8);
  if ((ulong)(*(long *)(this + 0x10) - (long)__dest) < __n) {
    SmallVectorBase::grow_pod
              ((SmallVectorBase *)this,this + 0x18,
               (long)__dest + (__n - *(long *)this) & 0xfffffffffffffff8,8);
    __dest = *(void **)(this + 8);
  }
  if (in_end._M_current != in_start._M_current) {
    memmove(__dest,in_start._M_current,__n);
    __dest = *(void **)(this + 8);
  }
  *(ulong *)(this + 8) = (long)__dest + __n;
  return;
}

Assistant:

void append(in_iter in_start, in_iter in_end) {
    size_type NumInputs = std::distance(in_start, in_end);
    // Grow allocated space if needed.
    if (NumInputs > size_type(this->capacity_ptr()-this->end()))
      this->grow(this->size()+NumInputs);

    // Copy the new elements over.
    this->uninitialized_copy(in_start, in_end, this->end());
    this->setEnd(this->end() + NumInputs);
  }